

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O3

void ** hash_AddElement(HashMapEntry **map,char *key,void *element)

{
  byte *pbVar1;
  HashMapEntry *pHVar2;
  byte bVar3;
  uint uVar4;
  
  bVar3 = *key;
  if (bVar3 == 0) {
    uVar4 = 0x811c9dc5;
  }
  else {
    pbVar1 = (byte *)(key + 1);
    uVar4 = 0x811c9dc5;
    do {
      uVar4 = (bVar3 ^ uVar4) * 0x1000193;
      bVar3 = *pbVar1;
      pbVar1 = pbVar1 + 1;
    } while (bVar3 != 0);
  }
  pHVar2 = (HashMapEntry *)malloc(0x20);
  if (pHVar2 == (HashMapEntry *)0x0) {
    err("%s: Failed to allocate new entry","hash_AddElement");
  }
  pHVar2->hash = (HalfHashType)(uVar4 >> 0x10);
  pHVar2->key = key;
  pHVar2->content = element;
  pHVar2->next = map[uVar4 & 0xffff];
  map[uVar4 & 0xffff] = pHVar2;
  return &pHVar2->content;
}

Assistant:

void **hash_AddElement(HashMap map, char const *key, void *element)
{
	HashType hashedKey = hash(key);
	HalfHashType index = hashedKey;
	struct HashMapEntry *newEntry = (struct HashMapEntry *)malloc(sizeof(*newEntry));

	if (!newEntry)
		err("%s: Failed to allocate new entry", __func__);

	newEntry->hash = hashedKey >> HALF_HASH_NB_BITS;
	newEntry->key = key;
	newEntry->content = element;
	newEntry->next = map[index];
	map[index] = newEntry;

	return &newEntry->content;
}